

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::handleResolve
          (RpcConnectionState *this,Reader *resolve)

{
  Reader descriptor;
  bool bVar1;
  Which WVar2;
  uint32_t id;
  Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *this_00;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *pPVar3;
  Exception *pEVar4;
  Own<capnp::ClientHook> *pOVar5;
  Fault local_3b0;
  Fault f_2;
  Exception *e;
  Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *fulfiller;
  Import *local_390;
  Import *import;
  Fault f_1;
  Exception local_350;
  int local_1f4;
  Fault local_1f0;
  Fault f;
  CapTableReader *pCStack_1e0;
  void *local_1d8;
  WirePointer *pWStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  OwnOwn<capnp::ClientHook> cap;
  undefined1 local_188 [8];
  Maybe<kj::Exception> exception;
  Own<capnp::ClientHook> replacement;
  Reader *resolve_local;
  RpcConnectionState *this_local;
  
  kj::Own<capnp::ClientHook>::Own((Own<capnp::ClientHook> *)((long)&exception.ptr.field_1 + 0x150));
  kj::Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)local_188);
  WVar2 = rpc::Resolve::Reader::which(resolve);
  if (WVar2 == CAP) {
    rpc::Resolve::Reader::getCap((Reader *)&f,resolve);
    descriptor._reader.capTable = pCStack_1e0;
    descriptor._reader.segment = (SegmentReader *)f.exception;
    descriptor._reader.data = local_1d8;
    descriptor._reader.pointers = pWStack_1d0;
    descriptor._reader._32_8_ = local_1c8;
    descriptor._reader._40_8_ = uStack_1c0;
    receiveCap((RpcConnectionState *)local_1b8,descriptor);
    kj::_::readMaybe<capnp::ClientHook>
              ((_ *)local_1a8,(Maybe<kj::Own<capnp::ClientHook>_> *)local_1b8);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe((Maybe<kj::Own<capnp::ClientHook>_> *)local_1b8);
    pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_1a8);
    if (pOVar5 == (Own<capnp::ClientHook> *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                (&local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa35,FAILED,(char *)0x0,"\"\'Resolve\' contained \'CapDescriptor.none\'.\"",
                 (char (*) [42])"\'Resolve\' contained \'CapDescriptor.none\'.");
      local_1f4 = 1;
      kj::_::Debug::Fault::~Fault(&local_1f0);
    }
    else {
      pOVar5 = kj::_::OwnOwn<capnp::ClientHook>::operator*((OwnOwn<capnp::ClientHook> *)local_1a8);
      pOVar5 = kj::mv<kj::Own<capnp::ClientHook>>(pOVar5);
      kj::Own<capnp::ClientHook>::operator=
                ((Own<capnp::ClientHook> *)((long)&exception.ptr.field_1 + 0x150),pOVar5);
      local_1f4 = 0;
    }
    kj::_::OwnOwn<capnp::ClientHook>::~OwnOwn((OwnOwn<capnp::ClientHook> *)local_1a8);
    if (local_1f4 != 0) goto LAB_0078f8ec;
  }
  else {
    if (WVar2 != EXCEPTION) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)&import,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa41,FAILED,(char *)0x0,"\"Unknown \'Resolve\' type.\"",
                 (char (*) [24])"Unknown \'Resolve\' type.");
      local_1f4 = 1;
      kj::_::Debug::Fault::~Fault((Fault *)&import);
      goto LAB_0078f8ec;
    }
    rpc::Resolve::Reader::getException((Reader *)&f_1,resolve);
    toException(&local_350,(Reader *)&f_1);
    kj::Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)local_188,&local_350);
    kj::Exception::~Exception(&local_350);
  }
  id = rpc::Resolve::Reader::getPromiseId(resolve);
  fulfiller = (Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *)
              ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Import>
              ::find(&this->imports,id);
  local_390 = kj::_::readMaybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Import>
                        ((Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Import_&> *)
                         &fulfiller);
  if (local_390 != (Import *)0x0) {
    this_00 = kj::_::readMaybe<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>>>
                        (&local_390->promiseFulfiller);
    if (this_00 == (Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *)0x0) {
      bVar1 = kj::Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::ImportClient_&>::
              operator!=(&local_390->importClient,(void *)0x0);
      if (bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                  (&local_3b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa50,FAILED,(char *)0x0,"\"Got \'Resolve\' for a non-promise import.\"",
                   (char (*) [40])"Got \'Resolve\' for a non-promise import.");
        local_1f4 = 9;
        kj::_::Debug::Fault::~Fault(&local_3b0);
      }
    }
    else {
      f_2.exception = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
      if (f_2.exception == (Exception *)0x0) {
        pPVar3 = kj::Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_>::get(this_00);
        pOVar5 = kj::mv<kj::Own<capnp::ClientHook>>
                           ((Own<capnp::ClientHook> *)((long)&exception.ptr.field_1 + 0x150));
        (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,pOVar5);
      }
      else {
        pPVar3 = kj::Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_>::get(this_00);
        pEVar4 = kj::mv<kj::Exception>(f_2.exception);
        (*pPVar3->_vptr_PromiseFulfiller[1])(pPVar3,pEVar4);
      }
    }
  }
  local_1f4 = 0;
LAB_0078f8ec:
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_188);
  kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)((long)&exception.ptr.field_1 + 0x150))
  ;
  return;
}

Assistant:

void handleResolve(const rpc::Resolve::Reader& resolve) {
    kj::Own<ClientHook> replacement;
    kj::Maybe<kj::Exception> exception;

    // Extract the replacement capability.
    switch (resolve.which()) {
      case rpc::Resolve::CAP:
        KJ_IF_MAYBE(cap, receiveCap(resolve.getCap())) {
          replacement = kj::mv(*cap);
        } else {
          KJ_FAIL_REQUIRE("'Resolve' contained 'CapDescriptor.none'.") { return; }
        }